

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_large_file.cc
# Opt level: O2

void __thiscall ImageChecker::~ImageChecker(ImageChecker *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x48);
  return;
}

Assistant:

~ImageChecker() override = default;